

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

void __thiscall tt::detail::ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  iVar1 = CurrentThread::tid();
  *this->m_tid = iVar1;
  this->m_tid = (pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  if ((this->m_name)._M_string_length == 0) {
    pcVar2 = "tt_Thread";
  }
  else {
    pcVar2 = (this->m_name)._M_dataplus._M_p;
  }
  *(char **)(in_FS_OFFSET + -0x38) = pcVar2;
  prctl(0xf);
  std::function<void_()>::operator()(&this->m_func);
  *(char **)(in_FS_OFFSET + -0x38) = "finish";
  return;
}

Assistant:

void runInThread(){
			*m_tid = tt::CurrentThread::tid();
			m_tid = NULL;
			m_latch->countDown();
			m_latch = NULL;
			
			tt::CurrentThread::t_threadName = m_name.empty() ? "tt_Thread" : m_name.c_str();

			::prctl(PR_SET_NAME,tt::CurrentThread::t_threadName);

	/*		try{
				m_func();
				tt::CurrentThread::t_threadName = "finish";
			}catch (const Exception& ex){
*/
			m_func();
			tt::CurrentThread::t_threadName = "finish";
		}